

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

trie_node * trie_remove(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint lvl)

{
  long lVar1;
  trie_node *ptVar2;
  void *pvVar3;
  undefined8 uVar4;
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var5;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while ((root->len == mask_len &&
           (uVar6 = (undefined4)*(undefined8 *)&((trie_node *)prefix)->prefix,
           a.u.addr6.addr[2] = in_stack_ffffffffffffff9c,
           a._0_12_ = *(undefined1 (*) [12])((long)&(root->prefix).u + 4), a.u.addr6.addr[3] = uVar6
           , b.u.addr6.addr[2] = in_stack_ffffffffffffffb4,
           b._0_12_ = *(undefined1 (*) [12])((long)&(((trie_node *)prefix)->prefix).u + 4),
           b.u.addr6.addr[3] = uVar6, _Var5 = lrtr_ip_addr_equal(a,b), _Var5))) {
      prefix = &root->rchild->prefix;
      ptVar2 = root->lchild;
      if (ptVar2 == (trie_node *)0x0) {
        if ((trie_node *)prefix == (trie_node *)0x0) {
          ptVar2 = root->parent;
          if (ptVar2 != (trie_node *)0x0) {
            (&ptVar2->rchild)[ptVar2->lchild == root] = (trie_node *)0x0;
          }
LAB_00102597:
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
            __stack_chk_fail();
          }
          return root;
        }
      }
      else if (((trie_node *)prefix == (trie_node *)0x0) ||
              (ptVar2->len < ((trie_node *)prefix)->len)) {
        prefix = &ptVar2->prefix;
      }
      pvVar3 = root->data;
      uVar4 = *(undefined8 *)((long)&(((trie_node *)prefix)->prefix).u + 4);
      *(undefined8 *)&root->prefix = *(undefined8 *)&((trie_node *)prefix)->prefix;
      *(undefined8 *)((long)&(root->prefix).u + 4) = uVar4;
      (root->prefix).u.addr6.addr[3] = (((trie_node *)prefix)->prefix).u.addr6.addr[3];
      mask_len = ((trie_node *)prefix)->len;
      root->len = mask_len;
      root->data = ((trie_node *)prefix)->data;
      ((trie_node *)prefix)->data = pvVar3;
      lvl = lvl + 1;
      root = (trie_node *)prefix;
    }
    _Var5 = is_left_child(prefix,lvl);
    if (_Var5) {
      root = root->lchild;
    }
    else {
      root = root->rchild;
    }
    if (root == (trie_node *)0x0) {
      root = (trie_node *)0x0;
      goto LAB_00102597;
    }
    lvl = lvl + 1;
  } while( true );
}

Assistant:

struct trie_node *trie_remove(struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      const unsigned int lvl)
{
	/* If the node has no children we can simply remove it
	 * If the node has children, we swap the node with the child that
	 * has the smaller prefix length and drop the child.
	 */
	if (prefix_is_same(root, prefix, mask_len)) {
		void *tmp;

		if (trie_is_leaf(root)) {
			deref_node(root);
			return root;
		}

		/* swap with the left child and drop the child */
		if (root->lchild && (!root->rchild || root->lchild->len < root->rchild->len)) {
			tmp = root->data;
			replace_node_data(root, root->lchild);
			root->lchild->data = tmp;

			return trie_remove(root->lchild, &root->lchild->prefix, root->lchild->len, lvl + 1);
		}

		/* swap with the right child and drop the child */
		tmp = root->data;
		replace_node_data(root, root->rchild);
		root->rchild->data = tmp;

		return trie_remove(root->rchild, &root->rchild->prefix, root->rchild->len, lvl + 1);
	}

	if (is_left_child(prefix, lvl)) {
		if (!root->lchild)
			return NULL;
		return trie_remove(root->lchild, prefix, mask_len, lvl + 1);
	}

	if (!root->rchild)
		return NULL;
	return trie_remove(root->rchild, prefix, mask_len, lvl + 1);
}